

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

void __thiscall icu_63::RegexCompile::matchStartType(RegexCompile *this)

{
  int8_t *piVar1;
  int iVar2;
  UVector64 *pUVar3;
  Regex8BitSet *pRVar4;
  int iVar5;
  bool bVar6;
  UBool UVar7;
  uint uVar8;
  UChar32 UVar9;
  UnicodeSet *extraout_RAX;
  UnicodeSet *extraout_RAX_00;
  UnicodeSet *pUVar10;
  UnicodeSet *extraout_RAX_01;
  RegexPattern *pRVar11;
  int32_t i;
  int32_t iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  UVector32 forwardedLength;
  UnicodeSet s;
  int local_bc;
  UVector32 local_b8;
  uint local_94;
  UnicodeSet local_90;
  undefined8 local_38;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  iVar2 = this->fRXPat->fCompiledPat->count;
  UVector32::UVector32(&local_b8,iVar2 + 1,this->fStatus);
  UVector32::setSize(&local_b8,iVar2 + 1);
  if (3 < iVar2) {
    iVar12 = 3;
    do {
      UVector32::setElementAt(&local_b8,0x7fffffff,iVar12);
      iVar12 = iVar12 + 1;
    } while (iVar2 != iVar12);
  }
  local_38 = 0;
  if (3 < iVar2) {
    bVar6 = true;
    uVar15 = 3;
    uVar14 = 0;
    local_bc = 0;
    do {
      pRVar11 = this->fRXPat;
      pUVar10 = (UnicodeSet *)pRVar11->fCompiledPat;
      iVar19 = *(int *)&(pUVar10->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher;
      uVar13 = (uint)uVar15;
      if ((int)uVar13 < 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if ((int)uVar13 < iVar19) {
          uVar21 = *(ulong *)(pUVar10->list + uVar15 * 2);
        }
      }
      iVar16 = 0;
      if (((-1 < (int)uVar13) && (iVar16 = 0, 0 < local_b8.count)) && ((int)uVar13 < local_b8.count)
         ) {
        iVar16 = *(int *)((long)&(((UnicodeFilter *)local_b8.elements)->super_UnicodeFunctor).
                                 super_UObject._vptr_UObject + uVar15 * 4);
      }
      uVar8 = uVar14;
      if (iVar16 < (int)uVar14) {
        uVar8 = 0;
      }
      if (((-1 < (int)uVar13) && (iVar16 < (int)uVar14)) &&
         ((uVar8 = 0, 0 < local_b8.count && ((int)uVar13 < local_b8.count)))) {
        uVar8 = *(uint *)((long)&(((UnicodeFilter *)local_b8.elements)->super_UnicodeFunctor).
                                 super_UObject._vptr_UObject + uVar15 * 4);
      }
      uVar14 = uVar8;
      uVar20 = (uint)uVar21;
      uVar8 = (uint)(uVar21 >> 0x18) & 0xff;
      switch(uVar8) {
      case 1:
        if (-2 < (int)uVar13) goto LAB_0026c2a1;
        goto LAB_0026c2c3;
      default:
        goto switchD_0026bd73_caseD_2;
      case 3:
        if (uVar14 == 0) {
          UnicodeSet::add(pRVar11->fInitialChars,uVar20 & 0xffffff);
LAB_0026c384:
          local_bc = local_bc + 2;
        }
        break;
      case 4:
        uVar8 = uVar13 + 1;
        uVar18 = 0;
        if ((-2 < (int)uVar13) && (uVar18 = 0, (int)uVar8 < iVar19)) {
          uVar18 = pUVar10->list[(ulong)uVar8 * 2] & 0xffffff;
        }
        if (uVar14 == 0) {
          UVar9 = icu_63::UnicodeString::char32At(&pRVar11->fLiteralText,uVar20 & 0xffffff);
          UnicodeSet::add(this->fRXPat->fInitialChars,UVar9);
          local_bc = local_bc + 1;
          pRVar11 = this->fRXPat;
          pRVar11->fInitialStringIdx = uVar20 & 0xffffff;
          pRVar11->fInitialStringLen = uVar18;
        }
        goto LAB_0026c0fd;
      case 6:
        uVar8 = uVar20 & 0xffffff;
        bVar6 = false;
        iVar19 = 0;
        if ((int)uVar13 < (int)uVar8) {
          if ((int)uVar8 < local_b8.count) {
            iVar19 = *(int *)((long)&(((UnicodeFilter *)local_b8.elements)->super_UnicodeFunctor).
                                     super_UObject._vptr_UObject + (ulong)(uVar20 & 0xffffff) * 4);
            pUVar10 = (UnicodeSet *)local_b8.elements;
          }
          if ((int)uVar14 < iVar19) {
            UVector32::setElementAt(&local_b8,uVar14,uVar8);
            pUVar10 = extraout_RAX_00;
          }
          goto switchD_0026bd73_caseD_f;
        }
        goto switchD_0026bd73_caseD_2;
      case 10:
        if (uVar14 == 0) {
          UnicodeSet::addAll(pRVar11->fInitialChars,pRVar11->fStaticSets[uVar20 & 0xffffff]);
          goto LAB_0026c384;
        }
        break;
      case 0xb:
        if (uVar14 == 0) {
          pUVar10 = (UnicodeSet *)UVector::elementAt(pRVar11->fSets,uVar20 & 0xffffff);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,pUVar10);
          goto LAB_0026c384;
        }
        break;
      case 0xc:
      case 0x13:
      case 0x15:
      case 0x1b:
        if (uVar14 == 0) {
          UnicodeSet::clear(pRVar11->fInitialChars);
          UnicodeSet::complement(this->fRXPat->fInitialChars);
          goto LAB_0026c384;
        }
        break;
      case 0xd:
        goto switchD_0026bd73_caseD_d;
      case 0xf:
      case 0x12:
      case 0x1c:
      case 0x1d:
      case 0x33:
        goto switchD_0026bd73_caseD_f;
      case 0x16:
        if (uVar14 == 0) {
          UnicodeSet::UnicodeSet(&local_90);
          UnicodeSet::applyIntPropertyValue
                    (&local_90,UCHAR_GENERAL_CATEGORY_MASK,0x200,this->fStatus);
          if ((uVar21 & 0xffffff) != 0) {
            UnicodeSet::complement(&local_90);
          }
          UnicodeSet::addAll(this->fRXPat->fInitialChars,&local_90);
LAB_0026c360:
          local_bc = local_bc + 2;
          UnicodeSet::~UnicodeSet(&local_90);
        }
        break;
      case 0x17:
        if (!bVar6) goto switchD_0026bd73_caseD_f;
        pRVar11->fStartType = 3;
LAB_0026bf8a:
        bVar6 = true;
        goto switchD_0026bd73_caseD_2;
      case 0x19:
      case 0x1a:
        uVar8 = 0;
        if ((-2 < (int)uVar13) && (uVar8 = 0, (int)(uVar13 + 1) < iVar19)) {
          uVar8 = pUVar10->list[(ulong)(uVar13 + 1) * 2] & 0xffffff;
        }
        if ((((int)uVar13 < -2) || (iVar19 <= (int)(uVar13 + 2))) ||
           (pUVar10 = (UnicodeSet *)pUVar10->list,
           *(int *)&(&(pUVar10->super_UnicodeFilter).super_UnicodeFunctor)[uVar13 + 2].super_UObject
                    ._vptr_UObject == 0)) {
          pUVar10 = (UnicodeSet *)0x0;
          if ((int)uVar8 < local_b8.count) {
            pUVar10 = (UnicodeSet *)
                      (ulong)*(uint *)((long)&(((UnicodeFilter *)local_b8.elements)->
                                              super_UnicodeFunctor).super_UObject._vptr_UObject +
                                      (ulong)uVar8 * 4);
          }
          if ((int)uVar14 < (int)pUVar10) {
            UVector32::setElementAt(&local_b8,uVar14,uVar8);
            pUVar10 = extraout_RAX;
          }
        }
        uVar13 = uVar13 + 3;
        goto switchD_0026bd73_caseD_f;
      case 0x1e:
      case 0x2b:
        if (bVar6) {
          pRVar11->fStartType = 4;
          goto LAB_0026bf8a;
        }
        goto switchD_0026bd73_caseD_f;
      case 0x24:
        uVar13 = uVar13 + 1;
switchD_0026bd73_caseD_d:
        uVar8 = uVar20 & 0xffffff;
        if ((int)uVar8 < (int)uVar13) {
LAB_0026c2a1:
          pUVar10 = (UnicodeSet *)(ulong)(uint)local_b8.count;
          if ((local_b8.count < 1) || (local_b8.count <= (int)(uVar13 + 1))) {
LAB_0026c2c3:
            bVar6 = false;
            uVar14 = 0;
            goto switchD_0026bd73_caseD_2;
          }
          uVar14 = *(uint *)((long)&(((UnicodeFilter *)local_b8.elements)->super_UnicodeFunctor).
                                    super_UObject._vptr_UObject + (ulong)(uVar13 + 1) * 4);
          pUVar10 = (UnicodeSet *)local_b8.elements;
        }
        else {
          pUVar10 = (UnicodeSet *)0x0;
          if ((int)uVar8 < local_b8.count) {
            pUVar10 = (UnicodeSet *)
                      (ulong)*(uint *)((long)&(((UnicodeFilter *)local_b8.elements)->
                                              super_UnicodeFunctor).super_UObject._vptr_UObject +
                                      (ulong)(uVar20 & 0xffffff) * 4);
          }
          if ((int)uVar14 < (int)pUVar10) {
            UVector32::setElementAt(&local_b8,uVar14,uVar8);
            pUVar10 = extraout_RAX_01;
          }
        }
        goto switchD_0026bd73_caseD_f;
      case 0x25:
      case 0x2c:
        iVar19 = (uVar8 == 0x25) + 1;
        while( true ) {
          iVar16 = (int)uVar15;
          uVar13 = iVar16 + 1;
          uVar15 = (ulong)uVar13;
          uVar21 = 0;
          if ((-2 < iVar16) && (pUVar3 = this->fRXPat->fCompiledPat, (int)uVar13 < pUVar3->count)) {
            uVar21 = (ulong)*(uint *)(pUVar3->elements + uVar15);
          }
          iVar5 = (int)(uVar21 >> 0x18);
          iVar17 = iVar19 + 2;
          if (iVar5 != 0x25) {
            iVar17 = iVar19;
          }
          iVar19 = (uint)(iVar5 == 0x2c) + iVar17;
          if (((iVar5 == 0x30) || (iVar5 == 0x26)) && (iVar19 = iVar19 + -1, iVar19 == 0)) break;
          if ((iVar5 == 6) && (uVar8 = (uint)uVar21 & 0xffffff, (int)uVar13 < (int)uVar8)) {
            iVar16 = 0;
            if ((int)uVar8 < local_b8.count) {
              iVar16 = *(int *)((long)&(((UnicodeFilter *)local_b8.elements)->super_UnicodeFunctor).
                                       super_UObject._vptr_UObject + (ulong)uVar8 * 4);
            }
            if ((int)uVar14 < iVar16) {
              UVector32::setElementAt(&local_b8,uVar14,uVar8);
            }
          }
        }
        pUVar10 = (UnicodeSet *)(ulong)(iVar16 + 1U);
        uVar13 = iVar16 + 1U;
        goto switchD_0026bd73_caseD_2;
      case 0x27:
        if (uVar14 == 0) {
          uVar20 = uVar20 & 0xffffff;
          UVar7 = u_hasBinaryProperty_63(uVar20,UCHAR_CASE_SENSITIVE);
          if (UVar7 == '\0') {
            UnicodeSet::add(this->fRXPat->fInitialChars,uVar20);
          }
          else {
            UnicodeSet::UnicodeSet(&local_90,uVar20,uVar20);
            UnicodeSet::closeOver(&local_90,2);
            UnicodeSet::addAll(this->fRXPat->fInitialChars,&local_90);
            UnicodeSet::~UnicodeSet(&local_90);
          }
          goto LAB_0026c384;
        }
        break;
      case 0x28:
        uVar8 = uVar13 + 1;
        uVar18 = 0;
        if ((-2 < (int)uVar13) && ((int)uVar8 < iVar19)) {
          uVar18 = pUVar10->list[(ulong)uVar8 * 2] & 0xffffff;
        }
        if (uVar14 == 0) {
          local_94 = uVar8;
          UVar9 = icu_63::UnicodeString::char32At(&pRVar11->fLiteralText,uVar20 & 0xffffff);
          UnicodeSet::UnicodeSet(&local_90);
          findCaseInsensitiveStarters(UVar9,&local_90);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,&local_90);
          local_bc = local_bc + 2;
          UnicodeSet::~UnicodeSet(&local_90);
          uVar8 = local_94;
        }
LAB_0026c0fd:
        pUVar10 = (UnicodeSet *)0x7fffffff;
        uVar13 = uVar14 ^ 0x7fffffff;
        uVar14 = uVar18 + uVar14;
        if (uVar13 <= uVar18) {
          uVar14 = 0x7fffffff;
        }
        bVar6 = false;
        uVar13 = uVar8;
        goto switchD_0026bd73_caseD_2;
      case 0x31:
        if (uVar14 == 0) {
          UnicodeSet::UnicodeSet(&local_90,pRVar11->fStaticSets[uVar20 & 0xffffff]);
          UnicodeSet::complement(&local_90);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,&local_90);
          goto LAB_0026c360;
        }
        break;
      case 0x32:
        if (uVar14 == 0) {
          pUVar10 = (UnicodeSet *)UVector::elementAt(pRVar11->fSets,uVar20 & 0xffffff);
          pUVar10 = UnicodeSet::addAll(this->fRXPat->fInitialChars,pUVar10);
LAB_0026c288:
          local_bc = local_bc + 2;
        }
        goto switchD_0026bd73_caseD_f;
      case 0x34:
        if (uVar14 == 0) {
          UnicodeSet::clear(pRVar11->fInitialChars);
          pUVar10 = UnicodeSet::complement(this->fRXPat->fInitialChars);
          goto LAB_0026c288;
        }
        goto switchD_0026bd73_caseD_f;
      case 0x38:
        if (uVar14 == 0) {
          UnicodeSet::UnicodeSet(&local_90);
          UnicodeSet::applyIntPropertyValue
                    (&local_90,UCHAR_GENERAL_CATEGORY_MASK,0x1000,this->fStatus);
          UnicodeSet::add(&local_90,9);
          if ((uVar21 & 0xffffff) != 0) {
            UnicodeSet::complement(&local_90);
          }
          UnicodeSet::addAll(this->fRXPat->fInitialChars,&local_90);
          goto LAB_0026c360;
        }
        break;
      case 0x39:
      case 0x3a:
        if (uVar14 == 0) {
          UnicodeSet::UnicodeSet(&local_90);
          UnicodeSet::add(&local_90,10,0xd);
          UnicodeSet::add(&local_90,0x85);
          UnicodeSet::add(&local_90,0x2028,0x2029);
          if ((uVar21 & 0xffffff) != 0) {
            UnicodeSet::complement(&local_90);
          }
          UnicodeSet::addAll(this->fRXPat->fInitialChars,&local_90);
          goto LAB_0026c360;
        }
      }
      uVar8 = uVar14 & 0xfffffffe;
      uVar14 = uVar14 + 1;
      pUVar10 = (UnicodeSet *)0x7fffffff;
      if (uVar8 == 0x7ffffffe) {
        uVar14 = 0x7fffffff;
      }
switchD_0026bd73_caseD_f:
      bVar6 = false;
switchD_0026bd73_caseD_2:
      uVar15 = (ulong)(uVar13 + 1);
    } while ((int)(uVar13 + 1) < iVar2);
    local_38 = CONCAT71((int7)((ulong)pUVar10 >> 8),local_bc == 1);
  }
  pUVar10 = this->fRXPat->fInitialChars;
  if (pUVar10 != (UnicodeSet *)0x0) {
    pRVar4 = this->fRXPat->fInitialChars8;
    uVar14 = 0;
    do {
      UVar7 = UnicodeSet::contains(pUVar10,uVar14);
      if (UVar7 != '\0') {
        piVar1 = pRVar4->d + (uVar14 >> 3);
        *piVar1 = *piVar1 | (byte)(1 << ((byte)uVar14 & 7));
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x100);
  }
  pRVar11 = this->fRXPat;
  if (pRVar11->fStartType == 3) goto LAB_0026c4d8;
  if (((char)local_38 == '\0') || (pRVar11->fMinMatchLen < 1)) {
    if (pRVar11->fStartType == 4) goto LAB_0026c4d8;
    if (pRVar11->fMinMatchLen == 0) {
      pRVar11->fStartType = 0;
      goto LAB_0026c4d8;
    }
    iVar12 = UnicodeSet::size(pRVar11->fInitialChars);
    pRVar11 = this->fRXPat;
    if (iVar12 != 1) {
      UVar7 = UnicodeSet::contains(pRVar11->fInitialChars,0,0x10ffff);
      if ((UVar7 == '\0') && (0 < this->fRXPat->fMinMatchLen)) {
        this->fRXPat->fStartType = 2;
      }
      else {
        this->fRXPat->fStartType = 0;
      }
      goto LAB_0026c4d8;
    }
    pRVar11->fStartType = 1;
    UVar9 = UnicodeSet::charAt(pRVar11->fInitialChars,0);
    pRVar11 = this->fRXPat;
  }
  else {
    UVar9 = icu_63::UnicodeString::char32At(&pRVar11->fLiteralText,pRVar11->fInitialStringIdx);
    pRVar11 = this->fRXPat;
    pRVar11->fStartType = 5;
  }
  pRVar11->fInitialChar = UVar9;
LAB_0026c4d8:
  UVector32::~UVector32(&local_b8);
  return;
}

Assistant:

void   RegexCompile::matchStartType() {
    if (U_FAILURE(*fStatus)) {
        return;
    }


    int32_t    loc;                    // Location in the pattern of the current op being processed.
    int32_t    op;                     // The op being processed
    int32_t    opType;                 // The opcode type of the op
    int32_t    currentLen = 0;         // Minimum length of a match to this point (loc) in the pattern
    int32_t    numInitialStrings = 0;  // Number of strings encountered that could match at start.

    UBool      atStart = TRUE;         // True if no part of the pattern yet encountered
                                       //   could have advanced the position in a match.
                                       //   (Maximum match length so far == 0)

    // forwardedLength is a vector holding minimum-match-length values that
    //   are propagated forward in the pattern by JMP or STATE_SAVE operations.
    //   It must be one longer than the pattern being checked because some  ops
    //   will jmp to a end-of-block+1 location from within a block, and we must
    //   count those when checking the block.
    int32_t end = fRXPat->fCompiledPat->size();
    UVector32  forwardedLength(end+1, *fStatus);
    forwardedLength.setSize(end+1);
    for (loc=3; loc<end; loc++) {
        forwardedLength.setElementAt(INT32_MAX, loc);
    }

    for (loc = 3; loc<end; loc++) {
        op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
        opType = URX_TYPE(op);

        // The loop is advancing linearly through the pattern.
        // If the op we are now at was the destination of a branch in the pattern,
        // and that path has a shorter minimum length than the current accumulated value,
        // replace the current accumulated value.
        if (forwardedLength.elementAti(loc) < currentLen) {
            currentLen = forwardedLength.elementAti(loc);
            U_ASSERT(currentLen>=0 && currentLen < INT32_MAX);
        }

        switch (opType) {
            // Ops that don't change the total length matched
        case URX_RESERVED_OP:
        case URX_END:
        case URX_FAIL:
        case URX_STRING_LEN:
        case URX_NOP:
        case URX_START_CAPTURE:
        case URX_END_CAPTURE:
        case URX_BACKSLASH_B:
        case URX_BACKSLASH_BU:
        case URX_BACKSLASH_G:
        case URX_BACKSLASH_Z:
        case URX_DOLLAR:
        case URX_DOLLAR_M:
        case URX_DOLLAR_D:
        case URX_DOLLAR_MD:
        case URX_RELOC_OPRND:
        case URX_STO_INP_LOC:
        case URX_BACKREF:         // BackRef.  Must assume that it might be a zero length match
        case URX_BACKREF_I:

        case URX_STO_SP:          // Setup for atomic or possessive blocks.  Doesn't change what can match.
        case URX_LD_SP:
            break;

        case URX_CARET:
            if (atStart) {
                fRXPat->fStartType = START_START;
            }
            break;

        case URX_CARET_M:
        case URX_CARET_M_UNIX:
            if (atStart) {
                fRXPat->fStartType = START_LINE;
            }
            break;

        case URX_ONECHAR:
            if (currentLen == 0) {
                // This character could appear at the start of a match.
                //   Add it to the set of possible starting characters.
                fRXPat->fInitialChars->add(URX_VAL(op));
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_SETREF:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn > 0 && sn < fRXPat->fSets->size());
                const UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(sn);
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;

        case URX_LOOP_SR_I:
            // [Set]*, like a SETREF, above, in what it can match,
            //  but may not match at all, so currentLen is not incremented.
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn > 0 && sn < fRXPat->fSets->size());
                const UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(sn);
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            atStart = FALSE;
            break;

        case URX_LOOP_DOT_I:
            if (currentLen == 0) {
                // .* at the start of a pattern.
                //    Any character can begin the match.
                fRXPat->fInitialChars->clear();
                fRXPat->fInitialChars->complement();
                numInitialStrings += 2;
            }
            atStart = FALSE;
            break;


        case URX_STATIC_SETREF:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn>0 && sn<URX_LAST_SET);
                const UnicodeSet *s = fRXPat->fStaticSets[sn];
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_STAT_SETREF_N:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                const UnicodeSet *s = fRXPat->fStaticSets[sn];
                UnicodeSet sc(*s);
                sc.complement();
                fRXPat->fInitialChars->addAll(sc);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_BACKSLASH_D:
            // Digit Char
             if (currentLen == 0) {
                 UnicodeSet s;
                 s.applyIntPropertyValue(UCHAR_GENERAL_CATEGORY_MASK, U_GC_ND_MASK, *fStatus);
                 if (URX_VAL(op) != 0) {
                     s.complement();
                 }
                 fRXPat->fInitialChars->addAll(s);
                 numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_H:
            // Horiz white space
            if (currentLen == 0) {
                UnicodeSet s;
                s.applyIntPropertyValue(UCHAR_GENERAL_CATEGORY_MASK, U_GC_ZS_MASK, *fStatus);
                s.add((UChar32)9);   // Tab
                if (URX_VAL(op) != 0) {
                    s.complement();
                }
                fRXPat->fInitialChars->addAll(s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_R:       // Any line ending sequence
        case URX_BACKSLASH_V:       // Any line ending code point, with optional negation
            if (currentLen == 0) {
                UnicodeSet s;
                s.add((UChar32)0x0a, (UChar32)0x0d);  // add range
                s.add((UChar32)0x85);
                s.add((UChar32)0x2028, (UChar32)0x2029);
                if (URX_VAL(op) != 0) {
                     // Complement option applies to URX_BACKSLASH_V only.
                     s.complement();
                }
                fRXPat->fInitialChars->addAll(s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_ONECHAR_I:
            // Case Insensitive Single Character.
            if (currentLen == 0) {
                UChar32  c = URX_VAL(op);
                if (u_hasBinaryProperty(c, UCHAR_CASE_SENSITIVE)) {
                    UnicodeSet starters(c, c);
                    starters.closeOver(USET_CASE_INSENSITIVE);
                    // findCaseInsensitiveStarters(c, &starters);
                    //   For ONECHAR_I, no need to worry about text chars that expand on folding into strings.
                    //   The expanded folding can't match the pattern.
                    fRXPat->fInitialChars->addAll(starters);
                } else {
                    // Char has no case variants.  Just add it as-is to the
                    //   set of possible starting chars.
                    fRXPat->fInitialChars->add(c);
                }
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_X:   // Grahpeme Cluster.  Minimum is 1, max unbounded.
        case URX_DOTANY_ALL:    // . matches one or two.
        case URX_DOTANY:
        case URX_DOTANY_UNIX:
            if (currentLen == 0) {
                // These constructs are all bad news when they appear at the start
                //   of a match.  Any character can begin the match.
                fRXPat->fInitialChars->clear();
                fRXPat->fInitialChars->complement();
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_JMPX:
            loc++;             // Except for extra operand on URX_JMPX, same as URX_JMP.
            U_FALLTHROUGH;
        case URX_JMP:
            {
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest < loc) {
                    // Loop of some kind.  Can safely ignore, the worst that will happen
                    //  is that we understate the true minimum length
                    currentLen = forwardedLength.elementAti(loc+1);

                } else {
                    // Forward jump.  Propagate the current min length to the target loc of the jump.
                    U_ASSERT(jmpDest <= end+1);
                    if (forwardedLength.elementAti(jmpDest) > currentLen) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                }
            }
            atStart = FALSE;
            break;

        case URX_JMP_SAV:
        case URX_JMP_SAV_X:
            // Combo of state save to the next loc, + jmp backwards.
            //   Net effect on min. length computation is nothing.
            atStart = FALSE;
            break;

        case URX_BACKTRACK:
            // Fails are kind of like a branch, except that the min length was
            //   propagated already, by the state save.
            currentLen = forwardedLength.elementAti(loc+1);
            atStart = FALSE;
            break;


        case URX_STATE_SAVE:
            {
                // State Save, for forward jumps, propagate the current minimum.
                //             of the state save.
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest > loc) {
                    if (currentLen < forwardedLength.elementAti(jmpDest)) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                }
            }
            atStart = FALSE;
            break;




        case URX_STRING:
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                int32_t stringLen   = URX_VAL(stringLenOp);
                U_ASSERT(URX_TYPE(stringLenOp) == URX_STRING_LEN);
                U_ASSERT(stringLenOp >= 2);
                if (currentLen == 0) {
                    // Add the starting character of this string to the set of possible starting
                    //   characters for this pattern.
                    int32_t stringStartIdx = URX_VAL(op);
                    UChar32  c = fRXPat->fLiteralText.char32At(stringStartIdx);
                    fRXPat->fInitialChars->add(c);

                    // Remember this string.  After the entire pattern has been checked,
                    //  if nothing else is identified that can start a match, we'll use it.
                    numInitialStrings++;
                    fRXPat->fInitialStringIdx = stringStartIdx;
                    fRXPat->fInitialStringLen = stringLen;
                }

                currentLen = safeIncrement(currentLen, stringLen);
                atStart = FALSE;
            }
            break;

        case URX_STRING_I:
            {
                // Case-insensitive string.  Unlike exact-match strings, we won't
                //   attempt a string search for possible match positions.  But we
                //   do update the set of possible starting characters.
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                int32_t stringLen   = URX_VAL(stringLenOp);
                U_ASSERT(URX_TYPE(stringLenOp) == URX_STRING_LEN);
                U_ASSERT(stringLenOp >= 2);
                if (currentLen == 0) {
                    // Add the starting character of this string to the set of possible starting
                    //   characters for this pattern.
                    int32_t stringStartIdx = URX_VAL(op);
                    UChar32  c = fRXPat->fLiteralText.char32At(stringStartIdx);
                    UnicodeSet s;
                    findCaseInsensitiveStarters(c, &s);
                    fRXPat->fInitialChars->addAll(s);
                    numInitialStrings += 2;  // Matching on an initial string not possible.
                }
                currentLen = safeIncrement(currentLen, stringLen);
                atStart = FALSE;
            }
            break;

        case URX_CTR_INIT:
        case URX_CTR_INIT_NG:
            {
                // Loop Init Ops.  These don't change the min length, but they are 4 word ops
                //   so location must be updated accordingly.
                // Loop Init Ops.
                //   If the min loop count == 0
                //      move loc forwards to the end of the loop, skipping over the body.
                //   If the min count is > 0,
                //      continue normal processing of the body of the loop.
                int32_t loopEndLoc   = (int32_t)fRXPat->fCompiledPat->elementAti(loc+1);
                        loopEndLoc   = URX_VAL(loopEndLoc);
                int32_t minLoopCount = (int32_t)fRXPat->fCompiledPat->elementAti(loc+2);
                if (minLoopCount == 0) {
                    // Min Loop Count of 0, treat like a forward branch and
                    //   move the current minimum length up to the target
                    //   (end of loop) location.
                    U_ASSERT(loopEndLoc <= end+1);
                    if (forwardedLength.elementAti(loopEndLoc) > currentLen) {
                        forwardedLength.setElementAt(currentLen, loopEndLoc);
                    }
                }
                loc+=3;  // Skips over operands of CTR_INIT
            }
            atStart = FALSE;
            break;


        case URX_CTR_LOOP:
        case URX_CTR_LOOP_NG:
            // Loop ops.
            //  The jump is conditional, backwards only.
            atStart = FALSE;
            break;

        case URX_LOOP_C:
            // More loop ops.  These state-save to themselves.
            //   don't change the minimum match
            atStart = FALSE;
            break;


        case URX_LA_START:
        case URX_LB_START:
            {
                // Look-around.  Scan forward until the matching look-ahead end,
                //   without processing the look-around block.  This is overly pessimistic.

                // Keep track of the nesting depth of look-around blocks.  Boilerplate code for
                //   lookahead contains two LA_END instructions, so count goes up by two
                //   for each LA_START.
                int32_t  depth = (opType == URX_LA_START? 2: 1);
                for (;;) {
                    loc++;
                    op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                    if (URX_TYPE(op) == URX_LA_START) {
                        depth+=2;
                    }
                    if (URX_TYPE(op) == URX_LB_START) {
                        depth++;
                    }
                    if (URX_TYPE(op) == URX_LA_END || URX_TYPE(op)==URX_LBN_END) {
                        depth--;
                        if (depth == 0) {
                            break;
                        }
                    }
                    if (URX_TYPE(op) == URX_STATE_SAVE) {
                        // Need this because neg lookahead blocks will FAIL to outside
                        //   of the block.
                        int32_t  jmpDest = URX_VAL(op);
                        if (jmpDest > loc) {
                            if (currentLen < forwardedLength.elementAti(jmpDest)) {
                                forwardedLength.setElementAt(currentLen, jmpDest);
                            }
                        }
                    }
                    U_ASSERT(loc <= end);
                }
            }
            break;

        case URX_LA_END:
        case URX_LB_CONT:
        case URX_LB_END:
        case URX_LBN_CONT:
        case URX_LBN_END:
            U_ASSERT(FALSE);     // Shouldn't get here.  These ops should be
                                 //  consumed by the scan in URX_LA_START and LB_START

            break;

        default:
            U_ASSERT(FALSE);
            }

        }


    // We have finished walking through the ops.  Check whether some forward jump
    //   propagated a shorter length to location end+1.
    if (forwardedLength.elementAti(end+1) < currentLen) {
        currentLen = forwardedLength.elementAti(end+1);
    }


    fRXPat->fInitialChars8->init(fRXPat->fInitialChars);


    // Sort out what we should check for when looking for candidate match start positions.
    // In order of preference,
    //     1.   Start of input text buffer.
    //     2.   A literal string.
    //     3.   Start of line in multi-line mode.
    //     4.   A single literal character.
    //     5.   A character from a set of characters.
    //
    if (fRXPat->fStartType == START_START) {
        // Match only at the start of an input text string.
        //    start type is already set.  We're done.
    } else if (numInitialStrings == 1 && fRXPat->fMinMatchLen > 0) {
        // Match beginning only with a literal string.
        UChar32  c = fRXPat->fLiteralText.char32At(fRXPat->fInitialStringIdx);
        U_ASSERT(fRXPat->fInitialChars->contains(c));
        fRXPat->fStartType   = START_STRING;
        fRXPat->fInitialChar = c;
    } else if (fRXPat->fStartType == START_LINE) {
        // Match at start of line in Multi-Line mode.
        // Nothing to do here; everything is already set.
    } else if (fRXPat->fMinMatchLen == 0) {
        // Zero length match possible.  We could start anywhere.
        fRXPat->fStartType = START_NO_INFO;
    } else if (fRXPat->fInitialChars->size() == 1) {
        // All matches begin with the same char.
        fRXPat->fStartType   = START_CHAR;
        fRXPat->fInitialChar = fRXPat->fInitialChars->charAt(0);
        U_ASSERT(fRXPat->fInitialChar != (UChar32)-1);
    } else if (fRXPat->fInitialChars->contains((UChar32)0, (UChar32)0x10ffff) == FALSE &&
        fRXPat->fMinMatchLen > 0) {
        // Matches start with a set of character smaller than the set of all chars.
        fRXPat->fStartType = START_SET;
    } else {
        // Matches can start with anything
        fRXPat->fStartType = START_NO_INFO;
    }

    return;
}